

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::get_rpc_method_name
          (string *__return_storage_ptr__,t_java_generator *this,string *name)

{
  string local_40;
  string *local_20;
  string *name_local;
  t_java_generator *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  if ((this->fullcamel_style_ & 1U) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)name);
    as_camel_case(__return_storage_ptr__,this,&local_40,false);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_java_generator::get_rpc_method_name(std::string name) {
  if (fullcamel_style_) {
    return as_camel_case(name, false);
  } else {
    return name;
  }
}